

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

ShellCommandHandler * __thiscall
llbuild::buildsystem::BuildSystem::resolveShellCommandHandler
          (BuildSystem *this,ShellCommand *command)

{
  ShellCommandHandler *pSVar1;
  ShellCommand *command_local;
  BuildSystem *this_local;
  
  pSVar1 = anon_unknown.dwarf_26382a::BuildSystemImpl::resolveShellCommandHandler
                     ((BuildSystemImpl *)this->impl,command);
  return pSVar1;
}

Assistant:

ShellCommandHandler*
BuildSystem::resolveShellCommandHandler(ShellCommand* command) {
  return static_cast<BuildSystemImpl*>(impl)->resolveShellCommandHandler(command);
}